

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateReplayer::Impl::parse_render_pass_dependencies2
          (Impl *this,Value *dependencies,VkSubpassDependency2 **out_deps)

{
  size_t size;
  undefined8 uVar1;
  bool bVar2;
  ulong uVar3;
  VkSubpassDependency2 *__s;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *pGVar4;
  Type pGVar5;
  Number NVar6;
  void **outpNext;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *this_00;
  bool bVar7;
  undefined8 local_38;
  
  if ((dependencies->data_).f.flags != 4) {
    __assert_fail("IsArray()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                  ,0x66a,
                  "SizeType rapidjson::GenericValue<rapidjson::UTF8<>>::Size() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  uVar3 = (ulong)(dependencies->data_).s.length;
  if (uVar3 == 0) {
    __s = (VkSubpassDependency2 *)0x0;
  }
  else {
    size = uVar3 * 0x30;
    __s = (VkSubpassDependency2 *)ScratchAllocator::allocate_raw(&this->allocator,size,0x10);
    if (__s != (VkSubpassDependency2 *)0x0) {
      memset(__s,0,size);
    }
  }
  if ((dependencies->data_).f.flags != 4) {
    __assert_fail("IsArray()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                  ,0x68c,
                  "ValueIterator rapidjson::GenericValue<rapidjson::UTF8<>>::Begin() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  this_00 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             *)((ulong)(dependencies->data_).s.str & 0xffffffffffff);
  pGVar4 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            *)rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::End(dependencies);
  bVar7 = pGVar4 == this_00;
  if (!bVar7) {
    outpNext = &__s->pNext;
    do {
      ((VkSubpassDependency2 *)(outpNext + -1))->sType = VK_STRUCTURE_TYPE_SUBPASS_DEPENDENCY_2;
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_00,"dependencyFlags");
      if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x40000000000000)
          == (undefined1  [16])0x0) {
LAB_0012d0b1:
        __assert_fail("data_.f.flags & kUintFlag",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                      ,0x719,
                      "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                     );
      }
      *(SizeType *)(outpNext + 4) = (pGVar5->data_).s.length;
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_00,"dstAccessMask");
      if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x40000000000000)
          == (undefined1  [16])0x0) goto LAB_0012d0b1;
      *(SizeType *)((long)outpNext + 0x1c) = (pGVar5->data_).s.length;
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_00,"srcAccessMask");
      if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x40000000000000)
          == (undefined1  [16])0x0) goto LAB_0012d0b1;
      *(SizeType *)(outpNext + 3) = (pGVar5->data_).s.length;
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_00,"dstStageMask");
      if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x40000000000000)
          == (undefined1  [16])0x0) goto LAB_0012d0b1;
      *(SizeType *)((long)outpNext + 0x14) = (pGVar5->data_).s.length;
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_00,"srcStageMask");
      if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x40000000000000)
          == (undefined1  [16])0x0) goto LAB_0012d0b1;
      *(SizeType *)(outpNext + 2) = (pGVar5->data_).s.length;
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_00,"srcSubpass");
      if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x40000000000000)
          == (undefined1  [16])0x0) goto LAB_0012d0b1;
      *(SizeType *)(outpNext + 1) = (pGVar5->data_).s.length;
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_00,"dstSubpass");
      if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x40000000000000)
          == (undefined1  [16])0x0) goto LAB_0012d0b1;
      *(SizeType *)((long)outpNext + 0xc) = (pGVar5->data_).s.length;
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_00,"viewOffset");
      if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x20000000000000)
          == (undefined1  [16])0x0) {
        __assert_fail("data_.f.flags & kIntFlag",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                      ,0x718,
                      "int rapidjson::GenericValue<rapidjson::UTF8<>>::GetInt() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                     );
      }
      *(SizeType *)((long)outpNext + 0x24) = (pGVar5->data_).s.length;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&stack0xffffffffffffffc8,(Ch *)this_00);
      uVar1 = local_38;
      NVar6.i = (I)rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                *)this_00);
      if (uVar1 != NVar6.i64) {
        pGVar5 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>(this_00,"pNext");
        bVar2 = parse_pnext_chain(this,pGVar5,outpNext,(StateCreatorInterface *)0x0,
                                  (DatabaseInterface *)0x0,(Value *)0x0);
        if (!bVar2) {
          return bVar7;
        }
      }
      this_00 = this_00 + 0x10;
      pGVar4 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                *)rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::End(dependencies);
      outpNext = outpNext + 6;
      bVar7 = this_00 == pGVar4;
    } while (!bVar7);
  }
  *out_deps = __s;
  return bVar7;
}

Assistant:

bool StateReplayer::Impl::parse_render_pass_dependencies2(const Value &dependencies, const VkSubpassDependency2 **out_deps)
{
	auto *infos = allocator.allocate_n_cleared<VkSubpassDependency2>(dependencies.Size());
	auto *ret = infos;

	for (auto itr = dependencies.Begin(); itr != dependencies.End(); ++itr, infos++)
	{
		auto &obj = *itr;
		infos->sType = VK_STRUCTURE_TYPE_SUBPASS_DEPENDENCY_2;
		parse_render_pass_dependencies_base(*infos, obj);
		infos->viewOffset = obj["viewOffset"].GetInt();
		if (obj.HasMember("pNext"))
			if (!parse_pnext_chain(obj["pNext"], &infos->pNext))
				return false;
	}

	*out_deps = ret;
	return true;
}